

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

string * __thiscall
flatbuffers::ts::TsGenerator::GenWriteMethod_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,Type *type)

{
  uint uVar1;
  char *__s;
  Type local_40;
  
  uVar1 = type->base_type - BASE_TYPE_UTYPE;
  switch(uVar1) {
  case 0:
    GetUnionUnderlyingType(type);
    goto LAB_001d2b6e;
  default:
    if (uVar1 < 0xc) {
      GenType_abi_cxx11_((string *)&local_40,(TsGenerator *)type,type);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (__return_storage_ptr__,&this->namer_,&local_40,
                 (ulong)(this->namer_).super_Namer.config_.types);
      std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
    if (type->base_type == BASE_TYPE_STRUCT) {
      __s = "Offset";
      if (type->struct_def->fixed != false) {
        __s = "Struct";
      }
    }
    else {
      __s = "Offset";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_40);
    return __return_storage_ptr__;
  case 3:
    local_40.base_type = BASE_TYPE_CHAR;
    break;
  case 5:
    local_40.base_type = BASE_TYPE_SHORT;
    break;
  case 7:
    local_40.base_type = BASE_TYPE_INT;
    break;
  case 9:
    local_40.base_type = BASE_TYPE_LONG;
  }
  local_40._4_8_ = 0;
  local_40._12_6_ = 0;
  local_40.enum_def._2_2_ = 0;
  local_40._20_6_ = 0;
LAB_001d2b6e:
  GenWriteMethod_abi_cxx11_(__return_storage_ptr__,this,&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GenWriteMethod(const Type &type) {
    // Forward to signed versions since unsigned versions don't exist
    switch (type.base_type) {
      case BASE_TYPE_UTYPE: return GenWriteMethod(GetUnionUnderlyingType(type));
      case BASE_TYPE_UCHAR: return GenWriteMethod(Type(BASE_TYPE_CHAR));
      case BASE_TYPE_USHORT: return GenWriteMethod(Type(BASE_TYPE_SHORT));
      case BASE_TYPE_UINT: return GenWriteMethod(Type(BASE_TYPE_INT));
      case BASE_TYPE_ULONG: return GenWriteMethod(Type(BASE_TYPE_LONG));
      default: break;
    }

    return IsScalar(type.base_type) ? namer_.Type(GenType(type))
                                    : (IsStruct(type) ? "Struct" : "Offset");
  }